

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

void cvui::update(String *theWindowName)

{
  int iVar1;
  cvui_context_t *pcVar2;
  undefined8 extraout_RAX;
  long lVar3;
  string local_30;
  
  pcVar2 = internal::getContext(theWindowName);
  (pcVar2->mouse).anyButton.justReleased = false;
  (pcVar2->mouse).anyButton.justPressed = false;
  lVar3 = 0;
  do {
    *(undefined2 *)(&(pcVar2->mouse).buttons[0].justReleased + lVar3) = 0;
    lVar3 = lVar3 + 3;
  } while (lVar3 != 9);
  internal::gScreen._96_8_ = 0;
  internal::gScreen._104_8_ = 0;
  internal::gScreen._112_4_ = 0;
  internal::gScreen._116_4_ = 0;
  internal::gScreen._120_8_ = 0;
  internal::gScreen._128_8_ = 0;
  internal::gScreen._136_4_ = 0;
  iVar1 = std::__cxx11::string::compare((char *)&internal::gInput);
  if (iVar1 != 0) {
    iVar1 = 0x28;
    if (0 < internal::gDelayWaitKey) {
      iVar1 = internal::gDelayWaitKey;
    }
    internal::gLastInputKeyPressed = cv::waitKeyEx(iVar1);
  }
  if (0 < internal::gDelayWaitKey) {
    internal::gLastKeyPressed = cv::waitKey(internal::gDelayWaitKey);
  }
  if (internal::gStackCount == -1) {
    return;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "Calling update() before finishing all begin*()/end*() calls. Did you forget to call a begin*() or an end*()? Check if every begin*() has an appropriate end*() call before you call update()."
             ,"");
  internal::error(2,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void update(const cv::String& theWindowName) {
	cvui_context_t& aContext = internal::getContext(theWindowName);

	aContext.mouse.anyButton.justReleased = false;
	aContext.mouse.anyButton.justPressed = false;

	for (int i = cvui::LEFT_BUTTON; i <= cvui::RIGHT_BUTTON; i++) {
		aContext.mouse.buttons[i].justReleased = false;
		aContext.mouse.buttons[i].justPressed = false;
	}

	internal::resetRenderingBuffer(internal::gScreen);

    bool aAnyInputFocused = internal::gInput.name != "";

	if (aAnyInputFocused) {
		internal::gLastInputKeyPressed = cv::waitKeyEx(internal::gDelayWaitKey > 0 ? internal::gDelayWaitKey : 40);
	}

	// If we were told to keep track of the keyboard shortcuts, we
	// proceed to handle opencv event queue.
	if (internal::gDelayWaitKey > 0) {
		internal::gLastKeyPressed = cv::waitKey(internal::gDelayWaitKey);
	}

	if (!internal::blockStackEmpty()) {
		internal::error(2, "Calling update() before finishing all begin*()/end*() calls. Did you forget to call a begin*() or an end*()? Check if every begin*() has an appropriate end*() call before you call update().");
	}
}